

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.h
# Opt level: O1

void __thiscall
gimage::HighDynamicRangeFusion<unsigned_short>::mulWellExposednessWeight
          (HighDynamicRangeFusion<unsigned_short> *this,ImageFloat *wp,
          Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image,float max_value)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  unsigned_short ***pppuVar4;
  pointer pfVar5;
  pointer pfVar6;
  uint uVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  lVar2 = image->height;
  if (0 < lVar2) {
    pfVar9 = **wp->img;
    lVar3 = image->width;
    uVar1 = image->depth;
    lVar8 = 0;
    do {
      if (0 < lVar3) {
        pppuVar4 = image->img;
        pfVar5 = (this->super_HighDynamicRangeFusionBase).gauss.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        pfVar6 = (this->super_HighDynamicRangeFusionBase).gauss.
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
        lVar13 = 0;
        pfVar10 = pfVar9;
        do {
          fVar14 = 1.0;
          if (0 < (int)uVar1) {
            uVar11 = 0;
            fVar14 = 1.0;
            do {
              uVar7 = (uint)pppuVar4[uVar11][lVar8][lVar13];
              if ((ushort)(int)max_value <= pppuVar4[uVar11][lVar8][lVar13]) {
                uVar7 = (int)max_value;
              }
              fVar15 = (float)((ulong)(uVar7 & 0xffff) * ((long)pfVar6 - (long)pfVar5 >> 2)) /
                       max_value;
              uVar12 = (ulong)fVar15;
              fVar14 = fVar14 * pfVar5[(long)(fVar15 - 9.223372e+18) & (long)uVar12 >> 0x3f | uVar12
                                      ];
              uVar11 = uVar11 + 1;
            } while (uVar1 != uVar11);
          }
          pfVar9 = pfVar10 + 1;
          *pfVar10 = fVar14 * *pfVar10;
          lVar13 = lVar13 + 1;
          pfVar10 = pfVar9;
        } while (lVar13 != lVar3);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar2);
  }
  return;
}

Assistant:

void mulWellExposednessWeight(ImageFloat &wp, const Image<T> &image, float max_value)
    {
      float *p=wp.getPtr(0, 0, 0);
      for (long k=0; k<image.getHeight(); k++)
      {
        for (long i=0; i<image.getWidth(); i++)
        {
          float v=1;
          for (int d=0; d<image.getDepth(); d++)
          {
            T pv=std::max(static_cast<T>(0), std::min(static_cast<T>(max_value),
              image.get(i, k, d)));

            v*=gauss[static_cast<size_t>(gauss.size()*pv/max_value)];
          }

          // multiply distance from center intensity, weighted by Gauss

          *p++ *= v;
        }
      }
    }